

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O3

void objundo(mcmcxdef *mctx,objucxdef *undoctx)

{
  ulong uVar1;
  ushort uVar2;
  
  uVar2 = undoctx->objucxprv;
  if (uVar2 == undoctx->objucxhead) {
    errsigf(undoctx->objucxerr,"TADS",0xc9);
  }
  uVar1 = (ulong)uVar2;
  if (undoctx->objucxbuf[uVar1] != '\x03') {
    do {
      if (uVar2 == undoctx->objucxtail) {
        errsigf(undoctx->objucxerr,"TADS",0xca);
      }
      uVar2 = *(ushort *)(undoctx->objucxbuf + uVar1 + 1);
      uVar1 = (ulong)uVar2;
    } while (undoctx->objucxbuf[uVar1] != '\x03');
  }
  do {
    obj1undo(mctx,undoctx);
  } while (undoctx->objucxhead != uVar2);
  return;
}

Assistant:

void objundo(mcmcxdef *mctx, objucxdef *undoctx)
{
    ushort prv;
    ushort sav;

    /* see if there's any more undo information */
    if (undoctx->objucxprv == undoctx->objucxhead)
        errsig(undoctx->objucxerr, ERR_NOUNDO);

    /* look for most recent savepoint marker */
    for (prv = undoctx->objucxprv ;; )
    {
        if (undoctx->objucxbuf[prv] == OBJUSAV)
        {
            sav = prv;
            break;
        }
        
        /* if we've reached the tail, there are no more undo records */
        if (prv == undoctx->objucxtail)
            errsig(undoctx->objucxerr, ERR_ICUNDO);

        /* get previous record */
        memcpy(&prv, &undoctx->objucxbuf[prv+1], sizeof(prv));
    }
    
    /* now undo everything until we get to the savepoint */
    do { obj1undo(mctx, undoctx); } while (undoctx->objucxhead != sav);
}